

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperSTREQ
          (internal *this,char *expected_expression,char *actual_expression,wchar_t *expected,
          wchar_t *actual)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  wchar_t **value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  bool bVar2;
  AssertionResult AVar3;
  wchar_t *local_68;
  wchar_t *local_60;
  string local_58;
  string local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  value_00;
  
  bVar2 = actual == (wchar_t *)0x0;
  value_00.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_expression;
  local_68 = actual;
  local_60 = expected;
  if (expected == (wchar_t *)0x0) {
LAB_004e4b48:
    if (bVar2) {
      *this = (internal)0x1;
      *(undefined8 *)(this + 8) = 0;
      goto LAB_004e4bc6;
    }
  }
  else if (actual != (wchar_t *)0x0) {
    iVar1 = wcscmp(expected,actual);
    bVar2 = iVar1 == 0;
    value_00.ptr_ = extraout_RDX;
    goto LAB_004e4b48;
  }
  PrintToString<wchar_t_const*>(&local_38,(testing *)&local_60,(wchar_t **)value_00.ptr_);
  PrintToString<wchar_t_const*>(&local_58,(testing *)&local_68,value);
  AVar3 = EqFailure(this,expected_expression,actual_expression,&local_38,&local_58,false);
  value_00 = AVar3.message_.ptr_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    value_00.ptr_ = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    value_00.ptr_ = extraout_RDX_01;
  }
LAB_004e4bc6:
  AVar3.message_.ptr_ = value_00.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTREQ(const char* expected_expression,
                               const char* actual_expression,
                               const wchar_t* expected,
                               const wchar_t* actual) {
  if (String::WideCStringEquals(expected, actual)) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   PrintToString(expected),
                   PrintToString(actual),
                   false);
}